

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wxcli.hpp
# Opt level: O3

string * __thiscall
ws::Cli::get_media_id(string *__return_storage_ptr__,Cli *this,string *path,bool no_retry)

{
  Headers *pHVar1;
  size_type *psVar2;
  _Base_ptr p_Var3;
  int iVar4;
  string *path_00;
  uint uVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  source_location *psVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  reference j;
  uint uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Error error;
  ulong uVar13;
  path *this_00;
  uint __len;
  initializer_list<httplib::MultipartFormData> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  int ret;
  size_type local_948;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_940;
  source_location local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  string *local_908;
  Result res;
  _Alloc_hider local_8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b0;
  _Alloc_hider local_8a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_890;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  json;
  Headers headers;
  MultipartFormDataItems items;
  _Any_data local_828;
  code *local_818;
  undefined8 uStack_810;
  string local_800;
  SSLClient cli;
  ifstream file;
  ulong local_3b8;
  streambuf local_3b0 [16];
  int aiStack_3a0 [122];
  stringstream file_ss;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->access_token)._M_string_length == 0) {
    get_access_token(this);
  }
  std::ifstream::ifstream(&file,(string *)path,_S_bin);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&cli,path,auto_format);
  cVar6 = std::filesystem::status((path *)&cli);
  local_908 = path;
  if ((cVar6 == '\0') || (cVar6 == -1)) {
    std::filesystem::__cxx11::path::~path((path *)&cli);
LAB_0013347e:
    psVar2 = &cli.super_ClientImpl.host_._M_string_length;
    cli.super_ClientImpl._vptr_ClientImpl = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cli,no_fmt_abi_cxx11_,DAT_0019eb20 + no_fmt_abi_cxx11_);
    cli.super_ClientImpl.host_.field_2._8_8_ = &PTR_s__workspace_llm4binary_github_lic_0019c848;
    log_helper<char_const(&)[14]>(CRITICAL,(FormatWithLoc *)&cli,(char (*) [14])"No such file.");
    if (cli.super_ClientImpl._vptr_ClientImpl != (_func_int **)psVar2) {
      operator_delete(cli.super_ClientImpl._vptr_ClientImpl,
                      cli.super_ClientImpl.host_._M_string_length + 1);
    }
  }
  else {
    iVar4 = *(int *)((long)aiStack_3a0 + *(long *)(_file + -0x18));
    std::filesystem::__cxx11::path::~path((path *)&cli);
    if (iVar4 != 0) goto LAB_0013347e;
  }
  std::istream::ignore((long)&file);
  std::ios::clear((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::istream::seekg(&file,0,0);
  if (0x1400000 < local_3b8) {
    psVar2 = &cli.super_ClientImpl.host_._M_string_length;
    cli.super_ClientImpl._vptr_ClientImpl = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&cli,no_fmt_abi_cxx11_,DAT_0019eb20 + no_fmt_abi_cxx11_);
    cli.super_ClientImpl.host_.field_2._8_8_ = &PTR_s__workspace_llm4binary_github_lic_0019c860;
    log_helper<char_const(&)[21]>
              (CRITICAL,(FormatWithLoc *)&cli,(char (*) [21])"The file is too big.");
    if (cli.super_ClientImpl._vptr_ClientImpl != (_func_int **)psVar2) {
      operator_delete(cli.super_ClientImpl._vptr_ClientImpl,
                      cli.super_ClientImpl.host_._M_string_length + 1);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&file_ss);
  std::ostream::operator<<(local_1a8,local_3b0);
  pHVar1 = &res.request_headers_;
  res.res_._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
  _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       pHVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res,"qyapi.weixin.qq.com","");
  httplib::SSLClient::SSLClient(&cli,(string *)&res);
  if (res.res_._M_t.
      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
      super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
      (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)pHVar1
     ) {
    operator_delete((void *)res.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,
                    res.request_headers_._M_t._M_impl._0_8_ + 1);
  }
  res.res_._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
  _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       pHVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res,"media","");
  std::__cxx11::stringbuf::str();
  this_00 = (path *)&ret;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (this_00,local_908,auto_format);
  if (local_948 == 0) {
LAB_001336d2:
    std::filesystem::__cxx11::path::path((path *)&headers);
  }
  else {
    uVar7 = (uint)local_930._M_impl;
    if (((ulong)local_930._M_impl & 3) == 0) {
      if (_ret[local_948 - 1] != '/') {
        if (((ulong)local_930._M_impl & 3) == 0) {
          lVar8 = std::filesystem::__cxx11::path::_List::end();
          this_00 = (path *)(lVar8 + -0x30);
          psVar9 = (source_location *)(lVar8 + -0x10);
          if (((ulong)local_930._M_impl & 3) != 0) {
            psVar9 = &local_930;
            this_00 = (path *)&ret;
          }
          uVar7 = (uint)psVar9->_M_impl;
        }
        else {
          this_00 = (path *)&ret;
        }
        if ((~uVar7 & 3) == 0) goto LAB_00133671;
      }
      goto LAB_001336d2;
    }
    if ((uVar7 & 3) != 3) goto LAB_001336d2;
LAB_00133671:
    std::filesystem::__cxx11::path::path((path *)&headers,this_00);
  }
  local_8c0._M_p = (pointer)&local_8b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8c0,headers._M_t._M_impl._0_8_,
             headers._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + headers._M_t._M_impl._0_8_
            );
  local_8a0._M_p = (pointer)&local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"application/octet-stream","");
  __l._M_len = 1;
  __l._M_array = (iterator)&res;
  std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::vector
            (&items,__l,(allocator_type *)&local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_p != &local_890) {
    operator_delete(local_8a0._M_p,local_890._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_p != &local_8b0) {
    operator_delete(local_8c0._M_p,local_8b0._M_allocated_capacity + 1);
  }
  p_Var3 = (_Base_ptr)&res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  if (res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != p_Var3) {
    operator_delete(res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (ulong)((long)&(res.request_headers_._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_right)->_M_color + 1));
  }
  if (res.res_._M_t.
      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
      super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
      (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)pHVar1
     ) {
    operator_delete((void *)res.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,
                    res.request_headers_._M_t._M_impl._0_8_ + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)&headers);
  std::filesystem::__cxx11::path::~path((path *)&ret);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&res,(char (*) [13])"Content-Type",(char (*) [20])"multipart/form-data");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&res;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&headers,__l_00,(ci *)&ret,(allocator_type *)&local_928);
  if (res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != p_Var3) {
    operator_delete(res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                    (ulong)((long)&(res.request_headers_._M_t._M_impl.super__Rb_tree_header.
                                    _M_header._M_right)->_M_color + 1));
  }
  if (res.res_._M_t.
      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
      super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
      (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)pHVar1
     ) {
    operator_delete((void *)res.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,
                    res.request_headers_._M_t._M_impl._0_8_ + 1);
  }
  std::operator+(&local_928,"/cgi-bin/media/upload?access_token=",&this->access_token);
  path_00 = local_908;
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_928,"&type=file");
  _ret = (pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ret == paVar12) {
    local_940._M_allocated_capacity = paVar12->_M_allocated_capacity;
    local_940._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
    _ret = (pointer)&local_940;
  }
  else {
    local_940._M_allocated_capacity = paVar12->_M_allocated_capacity;
  }
  local_948 = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  httplib::ClientImpl::Post(&res,&cli.super_ClientImpl,(string *)&ret,&headers,&items);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ret != &local_940) {
    operator_delete(_ret,local_940._M_allocated_capacity + 1);
  }
  paVar12 = &local_928.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != paVar12) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if (((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
       res.res_._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0) ||
     (*(int *)((long)res.res_._M_t.
                     super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                     .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) != 200)
     ) {
    _ret = (pointer)&local_940;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ret,no_fmt_abi_cxx11_,DAT_0019eb20 + no_fmt_abi_cxx11_);
    local_930._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019c878;
    httplib::to_string_abi_cxx11_(&local_928,(httplib *)(ulong)res.err_,error);
    log_helper<char_const(&)[25],char_const(&)[8],std::__cxx11::string>
              (CRITICAL,(FormatWithLoc *)&ret,(char (*) [25])"Get access token failed.",
               (char (*) [8])"Error: ",&local_928);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_928._M_dataplus._M_p != paVar12) {
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ret != &local_940) {
      operator_delete(_ret,local_940._M_allocated_capacity + 1);
    }
  }
  local_828._M_unused._M_object = (void *)0x0;
  local_828._8_8_ = 0;
  local_818 = (code *)0x0;
  uStack_810 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&json,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)res.res_._M_t.
                             super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                             .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78)
             ,(parser_callback_t *)&local_828,true,false);
  if (local_818 != (code *)0x0) {
    (*local_818)(&local_828,&local_828,__destroy_functor);
  }
  j = nlohmann::json_abi_v3_11_2::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)&json,"errcode");
  _ret = _ret & 0xffffffff00000000;
  nlohmann::json_abi_v3_11_2::detail::
  from_json<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
            (j,&ret);
  iVar4 = ret;
  if (ret < 0xa029) {
    if (ret == 0) goto LAB_00133bdf;
    if (ret == 0x9c4e) goto LAB_00133a55;
LAB_00133a5e:
    _ret = (pointer)&local_940;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ret,no_fmt_abi_cxx11_,DAT_0019eb20 + no_fmt_abi_cxx11_);
    local_930._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_0019c890;
    uVar7 = -iVar4;
    if (0 < iVar4) {
      uVar7 = iVar4;
    }
    __len = 1;
    if (9 < uVar7) {
      uVar13 = (ulong)uVar7;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar11 = (uint)uVar13;
        if (uVar11 < 100) {
          __len = __len - 2;
          goto LAB_00133b30;
        }
        if (uVar11 < 1000) {
          __len = __len - 1;
          goto LAB_00133b30;
        }
        if (uVar11 < 10000) goto LAB_00133b30;
        uVar13 = uVar13 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar11);
      __len = __len + 1;
    }
LAB_00133b30:
    local_928._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_928,(ulong)(__len + -(iVar4 >> 0x1f)),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_928._M_dataplus._M_p + (uint)-(iVar4 >> 0x1f),__len,uVar7);
    log_helper<char_const(&)[21],char_const(&)[10],std::__cxx11::string,char_const(&)[7],std::__cxx11::string&,char_const(&)[8],std::__cxx11::string_const&>
              (CRITICAL,(FormatWithLoc *)&ret,(char (*) [21])"Get media id failed.",
               (char (*) [10])0x1757f2,&local_928,(char (*) [7])",res: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)res.res_._M_t.
                      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                      .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78),
               (char (*) [8])",path: ",local_908);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_928._M_dataplus._M_p != paVar12) {
      operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
    }
    local_800.field_2._M_allocated_capacity = local_940._M_allocated_capacity;
    local_800._M_dataplus._M_p = _ret;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_ret == &local_940) goto LAB_00133bdf;
  }
  else {
    if ((ret != 0xa411) && (ret != 0xa029)) goto LAB_00133a5e;
LAB_00133a55:
    if (no_retry) goto LAB_00133a5e;
    get_access_token(this);
    get_media_id(&local_800,this,path_00,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_800._M_dataplus._M_p == &local_800.field_2) goto LAB_00133bdf;
  }
  operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
LAB_00133bdf:
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::operator[]<char_const>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&json,"media_id");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&json.m_data,false);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&json.m_data);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&res.request_headers_._M_t);
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr
            (&res.res_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&headers._M_t);
  std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::~vector
            (&items);
  httplib::SSLClient::~SSLClient(&cli);
  std::__cxx11::stringstream::~stringstream((stringstream *)&file_ss);
  std::ios_base::~ios_base(local_138);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string get_media_id(const std::string &path, bool no_retry = false)
    {
      if (access_token.empty()) get_access_token();
      std::ifstream file{path, std::ios::binary};
      if (!std::filesystem::exists(path) || !file.good())
      {
        critical(no_fmt, "No such file.");
      }
    
      file.ignore((std::numeric_limits<std::streamsize>::max)());
      size_t file_size = file.gcount();
      file.clear();
      file.seekg(std::ios_base::beg);
      if (file_size > 20 * 1024 * 1024)
      {
        critical(no_fmt, "The file is too big.");
      }
      
      std::stringstream file_ss;
      file_ss << file.rdbuf();
      
      httplib::SSLClient cli("qyapi.weixin.qq.com");
      httplib::MultipartFormDataItems items
          {
              httplib::MultipartFormData
                  {"media", file_ss.str(), std::filesystem::path(path).filename().string(), "application/octet-stream"}
          };
      httplib::Headers headers
          {
              {"Content-Type", "multipart/form-data"}
          };
      auto res = cli.Post("/cgi-bin/media/upload?access_token=" + access_token + "&type=file", headers, items);
      if (res == nullptr || res->status != 200)
      {
        critical(no_fmt, "Get access token failed.", "Error: ", httplib::to_string(res.error()));
      }
      
      auto json = nlohmann::json::parse(res->body);
      if (auto errcode = json["errcode"].get<int>(); errcode != 0)
      {
        if ((errcode == 41001 || errcode == 42001 || errcode == 40014) && !no_retry)
        {
          get_access_token();
          get_media_id(path, true);
        }
        else
        {
          critical(no_fmt,
                   "Get media id failed.",
                   "errcode: ", std::to_string(errcode), ",res: ", res->body, ",path: ", path);
        }
      }
      return json["media_id"].get<std::string>();
    }